

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O3

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createConstantExpr(LLVMPointerGraphBuilder *this,ConstantExpr *CE)

{
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>,_bool>
  pVar1;
  Pointer ptr;
  Pointer local_38;
  PSNode *local_28;
  ConstantExpr *local_20;
  
  local_38 = getConstantExprPointer(this,CE);
  local_28 = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,dg::Offset&>
                       ((PointerGraph *)this,&local_38.target,&local_38.offset);
  local_20 = CE;
  pVar1 = std::
          _Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<llvm::Value_const*&,dg::pta::PSNode*&>
                    ((_Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x188),&local_20,&local_28);
  (local_28->super_SubgraphNode<dg::pta::PSNode>).user_data = local_20;
  return (PSNodesSeq *)
         ((long)pVar1.first.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
         + 0x10);
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createConstantExpr(const llvm::ConstantExpr *CE) {
    Pointer ptr = getConstantExprPointer(CE);
    PSNode *node = PS.create<PSNodeType::CONSTANT>(ptr.target, ptr.offset);

    return addNode(CE, node);
}